

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O1

void Acec_PrintSignature(Vec_Wec_t *vMonos)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  
  printf("Output signature with %d monomials:\n",(ulong)(uint)vMonos->nSize);
  if (0 < vMonos->nSize) {
    lVar8 = 0;
    do {
      pVVar2 = vMonos->pArray;
      if ((long)pVVar2[lVar8].nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      iVar1 = pVVar2[lVar8].pArray[(long)pVVar2[lVar8].nSize + -1];
      pcVar6 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
      if (0 < iVar1) {
        pcVar6 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
      }
      iVar4 = -iVar1;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
      printf("  %s2^%d",pcVar6 + 0x4a,(ulong)(iVar4 - 1));
      uVar3 = (ulong)(uint)pVVar2[lVar8].nSize;
      if (1 < pVVar2[lVar8].nSize) {
        lVar7 = 0;
        do {
          if ((int)uVar3 <= lVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar5 = pVVar2[lVar8].pArray[lVar7];
          printf(" * ");
          if ((int)uVar5 < 0) {
            uVar5 = ~uVar5;
            pcVar6 = "i%d";
          }
          else {
            pcVar6 = "o%d";
          }
          printf(pcVar6,(ulong)uVar5);
          lVar7 = lVar7 + 1;
          uVar3 = (ulong)pVVar2[lVar8].nSize;
        } while (lVar7 < (long)(uVar3 - 1));
      }
      putchar(10);
      lVar8 = lVar8 + 1;
    } while (lVar8 < vMonos->nSize);
  }
  return;
}

Assistant:

void Acec_PrintSignature( Vec_Wec_t * vMonos )
{
    Vec_Int_t * vLevel; int i, k, Entry;
    printf( "Output signature with %d monomials:\n", Vec_WecSize(vMonos) );
    Vec_WecForEachLevel( vMonos, vLevel, i )
    {
        printf( "  %s2^%d", Vec_IntEntryLast(vLevel) > 0 ? "+":"-", Abc_AbsInt(Vec_IntEntryLast(vLevel))-1 );
        Vec_IntForEachEntryStop( vLevel, Entry, k, Vec_IntSize(vLevel)-1 )
        {
            printf( " * " );
            if ( Entry < 0 )
                printf( "i%d", -Entry-1 );
            else 
                printf( "o%d", Entry );
        }
        printf( "\n" );
    }
}